

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderQuads.cpp
# Opt level: O3

vector<glcts::_vec2,_std::allocator<glcts::_vec2>_> * __thiscall
glcts::TessellationShaderQuadsInnerTessellationLevelRounding::
getUniqueTessCoordinatesFromVertexDataSet
          (vector<glcts::_vec2,_std::allocator<glcts::_vec2>_> *__return_storage_ptr__,
          TessellationShaderQuadsInnerTessellationLevelRounding *this,float *raw_data,
          uint n_raw_data_vertices)

{
  pointer *pp_Var1;
  iterator __position;
  __normal_iterator<glcts::_vec2_*,_std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>_> _Var2
  ;
  ulong uVar3;
  uint uVar4;
  _vec2 local_38;
  
  (__return_storage_ptr__->super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (n_raw_data_vertices != 0) {
    uVar3 = 0;
    uVar4 = 0;
    do {
      local_38 = *(_vec2 *)(raw_data + uVar3);
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<glcts::_vec2*,std::vector<glcts::_vec2,std::allocator<glcts::_vec2>>>,__gnu_cxx::__ops::_Iter_equals_val<glcts::_vec2_const>>
                        ((__return_storage_ptr__->
                         super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                         (__return_storage_ptr__->
                         super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>)._M_impl.
                         super__Vector_impl_data._M_finish,&local_38);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (_Var2._M_current == __position._M_current) {
        if (_Var2._M_current ==
            (__return_storage_ptr__->super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<glcts::_vec2,std::allocator<glcts::_vec2>>::
          _M_realloc_insert<glcts::_vec2_const&>
                    ((vector<glcts::_vec2,std::allocator<glcts::_vec2>> *)__return_storage_ptr__,
                     __position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pp_Var1 = &(__return_storage_ptr__->
                     super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *pp_Var1 = *pp_Var1 + 1;
        }
      }
      uVar4 = uVar4 + 2;
      uVar3 = (ulong)((int)uVar3 + 6);
    } while (uVar4 < n_raw_data_vertices);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<_vec2> TessellationShaderQuadsInnerTessellationLevelRounding::getUniqueTessCoordinatesFromVertexDataSet(
	const float* raw_data, const unsigned int n_raw_data_vertices)
{
	std::vector<_vec2> result;

	for (unsigned int n_vertex = 0; n_vertex < n_raw_data_vertices; n_vertex += 2)
	{
		const float* vertex_data = raw_data + n_vertex * 3 /* components */;
		_vec2		 vertex(vertex_data[0], vertex_data[1]);

		if (std::find(result.begin(), result.end(), vertex) == result.end())
		{
			result.push_back(vertex);
		}

	} /* for (all vertices) */

	return result;
}